

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O2

PaError IsFormatSupported(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *inputParameters,
                         PaStreamParameters *outputParameters,double sampleRate)

{
  PaError PVar1;
  char *format;
  bool bVar2;
  bool bVar3;
  
  if (inputParameters == (PaStreamParameters *)0x0) {
    bVar2 = true;
    if (outputParameters != (PaStreamParameters *)0x0) {
LAB_0010cc84:
      paUtilErr_ = ValidateParameters(outputParameters,hostApi,StreamDirection_Out);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1852\n"
        ;
        goto LAB_0010cd15;
      }
      bVar3 = outputParameters->channelCount == 0;
      if (!bVar2) goto LAB_0010ccb8;
      if (outputParameters->channelCount != 0) goto LAB_0010cceb;
    }
LAB_0010ccb4:
    PVar1 = 0;
  }
  else {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (-1 < paUtilErr_) {
      bVar2 = inputParameters->channelCount == 0;
      if (outputParameters != (PaStreamParameters *)0x0) goto LAB_0010cc84;
      bVar3 = true;
      if (inputParameters->channelCount == 0) goto LAB_0010ccb4;
LAB_0010ccb8:
      PVar1 = TestParameters(hostApi,inputParameters,sampleRate,StreamDirection_In);
      if ((bool)(PVar1 != 0 | bVar3)) {
        return PVar1;
      }
LAB_0010cceb:
      PVar1 = TestParameters(hostApi,outputParameters,sampleRate,StreamDirection_Out);
      return PVar1;
    }
    format = 
    "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1844\n"
    ;
LAB_0010cd15:
    PaUtil_DebugPrint(format);
    PVar1 = paUtilErr_;
  }
  return PVar1;
}

Assistant:

static PaError IsFormatSupported( struct PaUtilHostApiRepresentation *hostApi,
                                  const PaStreamParameters *inputParameters,
                                  const PaStreamParameters *outputParameters,
                                  double sampleRate )
{
    int inputChannelCount, outputChannelCount;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    
    if( inputParameters )
    {
        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;

        /* all standard sample formats are supported by the buffer adapter,
            this implementation doesn't support any custom sample formats */
        if( inputSampleFormat & paCustomFormat )
            return paSampleFormatNotSupported;
            
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that input device can support inputChannelCount */
        if( inputChannelCount > hostApi->deviceInfos[ inputParameters->device ]->maxInputChannels )
            return paInvalidChannelCount;

        /* validate inputStreamInfo */
        if( inputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */
    }
    else
    {
        inputChannelCount = 0;
    }

    if( outputParameters )
    {
        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;

        /* all standard sample formats are supported by the buffer adapter,
            this implementation doesn't support any custom sample formats */
        if( outputSampleFormat & paCustomFormat )
            return paSampleFormatNotSupported;
            
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( outputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that output device can support outputChannelCount */
        if( outputChannelCount > hostApi->deviceInfos[ outputParameters->device ]->maxOutputChannels )
            return paInvalidChannelCount;

        /* validate outputStreamInfo */
        if( outputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */
    }
    else
    {
        outputChannelCount = 0;
    }
    
    /*
        IMPLEMENT ME:

            - if a full duplex stream is requested, check that the combination
                of input and output parameters is supported if necessary

            - check that the device supports sampleRate

        Because the buffer adapter handles conversion between all standard
        sample formats, the following checks are only required if paCustomFormat
        is implemented, or under some other unusual conditions.

            - check that input device can support inputSampleFormat, or that
                we have the capability to convert from inputSampleFormat to
                a native format

            - check that output device can support outputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format
    */


    /* suppress unused variable warnings */
    (void) sampleRate;

    return paFormatIsSupported;
}